

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeMakeReady(Vdbe *p,Parse *pParse)

{
  void *pvVar1;
  bool local_51;
  undefined1 local_50 [8];
  ReusableSpace x;
  int local_30;
  int n;
  int nArg;
  int nCursor;
  int nMem;
  int nVar;
  sqlite3 *db;
  Parse *pParse_local;
  Vdbe *p_local;
  
  _nMem = p->db;
  nCursor = (int)pParse->nVar;
  n = pParse->nTab;
  local_30 = pParse->nMaxArg;
  nArg = n + pParse->nMem;
  if ((n == 0) && (0 < nArg)) {
    nArg = nArg + 1;
  }
  x.nNeeded._4_4_ = p->nOp * 0x18;
  local_50 = (undefined1  [8])(&p->aOp->opcode + x.nNeeded._4_4_);
  x.pSpace = (u8 *)(long)(int)(pParse->szOpAlloc + p->nOp * -0x18 & 0xfffffff8);
  db = (sqlite3 *)pParse;
  pParse_local = (Parse *)p;
  resolveP2Values(p,&local_30);
  local_51 = false;
  if (*(char *)&db->aDb != '\0') {
    local_51 = *(char *)((long)&db->aDb + 1) != '\0';
  }
  *(ushort *)((long)&pParse_local->newmask + 1) =
       *(ushort *)((long)&pParse_local->newmask + 1) & 0xff7f | (ushort)local_51 << 7;
  if ((*(char *)((long)&db->xRollbackCallback + 3) != '\0') && (nArg < 10)) {
    nArg = 10;
  }
  *(ushort *)((long)&pParse_local->newmask + 1) =
       *(ushort *)((long)&pParse_local->newmask + 1) & 0xfffc;
  x.nFree = 0;
  pvVar1 = allocSpace((ReusableSpace *)local_50,(void *)0x0,(long)nArg * 0x38);
  *(void **)&(pParse_local->constraintName).n = pvVar1;
  pvVar1 = allocSpace((ReusableSpace *)local_50,(void *)0x0,(long)nCursor * 0x38);
  *(void **)&pParse_local->nMaxArg = pvVar1;
  pvVar1 = allocSpace((ReusableSpace *)local_50,(void *)0x0,(long)local_30 << 3);
  *(void **)&pParse_local->writeMask = pvVar1;
  pvVar1 = allocSpace((ReusableSpace *)local_50,(void *)0x0,(long)n << 3);
  *(void **)&pParse_local->regRowid = pvVar1;
  if (x.nFree != 0) {
    local_50 = (undefined1  [8])sqlite3DbMallocRawNN(_nMem,x.nFree);
    *(undefined1 (*) [8])&(pParse_local->sNameToken).n = local_50;
    x.pSpace = (u8 *)x.nFree;
    if (_nMem->mallocFailed == '\0') {
      pvVar1 = allocSpace((ReusableSpace *)local_50,*(void **)&(pParse_local->constraintName).n,
                          (long)nArg * 0x38);
      *(void **)&(pParse_local->constraintName).n = pvVar1;
      pvVar1 = allocSpace((ReusableSpace *)local_50,*(void **)&pParse_local->nMaxArg,
                          (long)nCursor * 0x38);
      *(void **)&pParse_local->nMaxArg = pvVar1;
      pvVar1 = allocSpace((ReusableSpace *)local_50,*(void **)&pParse_local->writeMask,
                          (long)local_30 << 3);
      *(void **)&pParse_local->writeMask = pvVar1;
      pvVar1 = allocSpace((ReusableSpace *)local_50,*(void **)&pParse_local->regRowid,(long)n << 3);
      *(void **)&pParse_local->regRowid = pvVar1;
    }
  }
  pParse_local->pParentParse = db->pParse;
  db->pParse = (Parse *)0x0;
  *(ushort *)((long)&pParse_local->newmask + 1) =
       *(ushort *)((long)&pParse_local->newmask + 1) & 0xfff3 |
       (*(byte *)((long)&db->xRollbackCallback + 3) & 3) << 2;
  if (_nMem->mallocFailed == '\0') {
    pParse_local->iRangeReg = n;
    pParse_local->isMultiWrite = (char)(short)nCursor;
    pParse_local->mayAbort = (char)((ushort)(short)nCursor >> 8);
    initMemArray(*(Mem **)&pParse_local->nMaxArg,nCursor,_nMem,1);
    pParse_local->nRangeReg = nArg;
    initMemArray(*(Mem **)&(pParse_local->constraintName).n,nArg,_nMem,0x80);
    memset(*(void **)&pParse_local->regRowid,0,(long)n << 3);
  }
  else {
    pParse_local->isMultiWrite = '\0';
    pParse_local->mayAbort = '\0';
    pParse_local->iRangeReg = 0;
    pParse_local->nRangeReg = 0;
  }
  sqlite3VdbeRewind((Vdbe *)pParse_local);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMakeReady(
  Vdbe *p,                       /* The VDBE */
  Parse *pParse                  /* Parsing context */
){
  sqlite3 *db;                   /* The database connection */
  int nVar;                      /* Number of parameters */
  int nMem;                      /* Number of VM memory registers */
  int nCursor;                   /* Number of cursors required */
  int nArg;                      /* Number of arguments in subprograms */
  int n;                         /* Loop counter */
  struct ReusableSpace x;        /* Reusable bulk memory */

  assert( p!=0 );
  assert( p->nOp>0 );
  assert( pParse!=0 );
  assert( p->magic==VDBE_MAGIC_INIT );
  assert( pParse==p->pParse );
  db = p->db;
  assert( db->mallocFailed==0 );
  nVar = pParse->nVar;
  nMem = pParse->nMem;
  nCursor = pParse->nTab;
  nArg = pParse->nMaxArg;
  
  /* Each cursor uses a memory cell.  The first cursor (cursor 0) can
  ** use aMem[0] which is not otherwise used by the VDBE program.  Allocate
  ** space at the end of aMem[] for cursors 1 and greater.
  ** See also: allocateCursor().
  */
  nMem += nCursor;
  if( nCursor==0 && nMem>0 ) nMem++;  /* Space for aMem[0] even if not used */

  /* Figure out how much reusable memory is available at the end of the
  ** opcode array.  This extra memory will be reallocated for other elements
  ** of the prepared statement.
  */
  n = ROUND8(sizeof(Op)*p->nOp);              /* Bytes of opcode memory used */
  x.pSpace = &((u8*)p->aOp)[n];               /* Unused opcode memory */
  assert( EIGHT_BYTE_ALIGNMENT(x.pSpace) );
  x.nFree = ROUNDDOWN8(pParse->szOpAlloc - n);  /* Bytes of unused memory */
  assert( x.nFree>=0 );
  assert( EIGHT_BYTE_ALIGNMENT(&x.pSpace[x.nFree]) );

  resolveP2Values(p, &nArg);
  p->usesStmtJournal = (u8)(pParse->isMultiWrite && pParse->mayAbort);
  if( pParse->explain && nMem<10 ){
    nMem = 10;
  }
  p->expired = 0;

  /* Memory for registers, parameters, cursor, etc, is allocated in one or two
  ** passes.  On the first pass, we try to reuse unused memory at the 
  ** end of the opcode array.  If we are unable to satisfy all memory
  ** requirements by reusing the opcode array tail, then the second
  ** pass will fill in the remainder using a fresh memory allocation.  
  **
  ** This two-pass approach that reuses as much memory as possible from
  ** the leftover memory at the end of the opcode array.  This can significantly
  ** reduce the amount of memory held by a prepared statement.
  */
  x.nNeeded = 0;
  p->aMem = allocSpace(&x, 0, nMem*sizeof(Mem));
  p->aVar = allocSpace(&x, 0, nVar*sizeof(Mem));
  p->apArg = allocSpace(&x, 0, nArg*sizeof(Mem*));
  p->apCsr = allocSpace(&x, 0, nCursor*sizeof(VdbeCursor*));
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
  p->anExec = allocSpace(&x, 0, p->nOp*sizeof(i64));
#endif
  if( x.nNeeded ){
    x.pSpace = p->pFree = sqlite3DbMallocRawNN(db, x.nNeeded);
    x.nFree = x.nNeeded;
    if( !db->mallocFailed ){
      p->aMem = allocSpace(&x, p->aMem, nMem*sizeof(Mem));
      p->aVar = allocSpace(&x, p->aVar, nVar*sizeof(Mem));
      p->apArg = allocSpace(&x, p->apArg, nArg*sizeof(Mem*));
      p->apCsr = allocSpace(&x, p->apCsr, nCursor*sizeof(VdbeCursor*));
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
      p->anExec = allocSpace(&x, p->anExec, p->nOp*sizeof(i64));
#endif
    }
  }

  p->pVList = pParse->pVList;
  pParse->pVList =  0;
  p->explain = pParse->explain;
  if( db->mallocFailed ){
    p->nVar = 0;
    p->nCursor = 0;
    p->nMem = 0;
  }else{
    p->nCursor = nCursor;
    p->nVar = (ynVar)nVar;
    initMemArray(p->aVar, nVar, db, MEM_Null);
    p->nMem = nMem;
    initMemArray(p->aMem, nMem, db, MEM_Undefined);
    memset(p->apCsr, 0, nCursor*sizeof(VdbeCursor*));
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
    memset(p->anExec, 0, p->nOp*sizeof(i64));
#endif
  }
  sqlite3VdbeRewind(p);
}